

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O3

void __thiscall
RVO::KdTree::queryAgentTreeRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  size_t node_00;
  pointer pAVar1;
  size_t *psVar2;
  pointer pAVar3;
  size_t i;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  
  pAVar3 = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = pAVar3[node].begin;
  if (10 < pAVar3[node].end - sVar4) {
    pAVar1 = pAVar3 + node;
    do {
      sVar4 = pAVar1->left;
      node_00 = pAVar1->right;
      fVar8 = (agent->position_).x_;
      fVar10 = (agent->position_).y_;
      auVar6._0_4_ = pAVar3[sVar4].minX - fVar8;
      auVar6._4_4_ = pAVar3[node_00].minX - fVar8;
      auVar6._8_4_ = 0.0 - fVar8;
      auVar6._12_4_ = 0.0 - fVar8;
      auVar6 = maxps(auVar6,ZEXT816(0));
      auVar7._0_4_ = fVar8 - pAVar3[sVar4].maxX;
      auVar7._4_4_ = fVar8 - pAVar3[node_00].maxX;
      auVar7._8_4_ = fVar8 - 0.0;
      auVar7._12_4_ = fVar8 - 0.0;
      auVar7 = maxps(auVar7,ZEXT816(0));
      auVar5._0_4_ = pAVar3[sVar4].minY - fVar10;
      auVar5._4_4_ = pAVar3[node_00].minY - fVar10;
      auVar5._8_4_ = 0.0 - fVar10;
      auVar5._12_4_ = 0.0 - fVar10;
      auVar5 = maxps(auVar5,ZEXT816(0));
      auVar9._0_4_ = fVar10 - pAVar3[sVar4].maxY;
      auVar9._4_4_ = fVar10 - pAVar3[node_00].maxY;
      auVar9._8_4_ = fVar10 - 0.0;
      auVar9._12_4_ = fVar10 - 0.0;
      auVar9 = maxps(auVar9,ZEXT816(0));
      fVar8 = auVar9._0_4_ * auVar9._0_4_ +
              auVar5._0_4_ * auVar5._0_4_ +
              auVar6._0_4_ * auVar6._0_4_ + auVar7._0_4_ * auVar7._0_4_;
      fVar10 = auVar9._4_4_ * auVar9._4_4_ +
               auVar5._4_4_ * auVar5._4_4_ +
               auVar6._4_4_ * auVar6._4_4_ + auVar7._4_4_ * auVar7._4_4_;
      if (fVar10 <= fVar8) {
        if (*rangeSq <= fVar10) {
          return;
        }
        queryAgentTreeRecursive(this,agent,rangeSq,node_00);
        if (*rangeSq <= fVar8) {
          return;
        }
        pAVar3 = (this->agentTree_).
                 super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = &pAVar3[node].left;
      }
      else {
        if (*rangeSq <= fVar8) {
          return;
        }
        queryAgentTreeRecursive(this,agent,rangeSq,sVar4);
        if (*rangeSq <= fVar10) {
          return;
        }
        pAVar3 = (this->agentTree_).
                 super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = &pAVar3[node].right;
      }
      node = *psVar2;
      pAVar1 = pAVar3 + node;
      sVar4 = pAVar3[node].begin;
    } while (10 < pAVar3[node].end - sVar4);
  }
  if (sVar4 < pAVar3[node].end) {
    do {
      Agent::insertAgentNeighbor
                (agent,(this->agents_).
                       super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar4],rangeSq);
      sVar4 = sVar4 + 1;
    } while (sVar4 < (this->agentTree_).
                     super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                     ._M_impl.super__Vector_impl_data._M_start[node].end);
  }
  return;
}

Assistant:

void KdTree::queryAgentTreeRecursive(Agent *agent, float &rangeSq,
                                     std::size_t node) const {
  if (agentTree_[node].end - agentTree_[node].begin <= RVO_MAX_LEAF_SIZE) {
    for (std::size_t i = agentTree_[node].begin; i < agentTree_[node].end;
         ++i) {
      agent->insertAgentNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, agentTree_[agentTree_[node].left].minX - agent->position_.x());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].left].maxX);
    const float distLeftMinY = std::max(
        0.0F, agentTree_[agentTree_[node].left].minY - agent->position_.y());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].left].maxY);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, agentTree_[agentTree_[node].right].minX - agent->position_.x());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].right].maxX);
    const float distRightMinY = std::max(
        0.0F, agentTree_[agentTree_[node].right].minY - agent->position_.y());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].right].maxY);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);

        if (distSqRight < rangeSq) {
          queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);
        }
      }
    } else if (distSqRight < rangeSq) {
      queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);

      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);
      }
    }
  }
}